

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_yin.c
# Opt level: O3

void ypr_substmt(lys_ypr_ctx_conflict *pctx,ly_stmt substmt,uint8_t substmt_index,char *text,
                void *exts)

{
  uint16_t *puVar1;
  byte bVar2;
  char *pcVar3;
  char *attr_name;
  ulong uVar4;
  uint64_t u;
  ulong uVar5;
  lysp_ext_instance *ext;
  bool flag;
  int8_t extflag;
  int8_t local_39;
  char *local_38;
  
  local_39 = '\0';
  if (text != (char *)0x0) {
    bVar2 = lys_stmt_flags(substmt);
    flag = (bVar2 & 1) != 0;
    local_38 = text;
    if (flag) {
      local_39 = '\x01';
      pcVar3 = lys_stmt_str(substmt);
      attr_name = (char *)0x0;
      text = (char *)0x0;
    }
    else {
      pcVar3 = lys_stmt_str(substmt);
      attr_name = lys_stmt_arg(substmt);
    }
    ypr_open(pctx,pcVar3,attr_name,text,flag);
    puVar1 = &(pctx->field_0).field_0.level;
    *puVar1 = *puVar1 + 1;
    uVar5 = 0;
    ext = (lysp_ext_instance *)exts;
    while( true ) {
      if (exts == (void *)0x0) {
        uVar4 = 0;
      }
      else {
        uVar4 = *(ulong *)((long)exts + -8);
      }
      if (uVar4 <= uVar5) break;
      yprp_extension_instance(pctx,substmt,substmt_index,ext,&local_39);
      uVar5 = uVar5 + 1;
      ext = ext + 1;
    }
    bVar2 = lys_stmt_flags(substmt);
    if ((bVar2 & 1) != 0) {
      pcVar3 = lys_stmt_arg(substmt);
      ypr_yin_arg(pctx,pcVar3,local_38);
    }
    puVar1 = &(pctx->field_0).field_0.level;
    *puVar1 = *puVar1 - 1;
    pcVar3 = lys_stmt_str(substmt);
    ypr_close(pctx,pcVar3,local_39);
  }
  return;
}

Assistant:

static void
ypr_substmt(struct lys_ypr_ctx *pctx, enum ly_stmt substmt, uint8_t substmt_index, const char *text, void *exts)
{
    int8_t extflag = 0;

    if (!text) {
        /* nothing to print */
        return;
    }

    if (lys_stmt_flags(substmt) & LY_STMT_FLAG_YIN) {
        extflag = 1;
        ypr_open(pctx, lys_stmt_str(substmt), NULL, NULL, extflag);
    } else {
        ypr_open(pctx, lys_stmt_str(substmt), lys_stmt_arg(substmt), text, extflag);
    }

    LEVEL++;
    yprp_extension_instances(pctx, substmt, substmt_index, exts, &extflag);

    /* argument as yin-element */
    if (lys_stmt_flags(substmt) & LY_STMT_FLAG_YIN) {
        ypr_yin_arg(pctx, lys_stmt_arg(substmt), text);
    }

    LEVEL--;
    ypr_close(pctx, lys_stmt_str(substmt), extflag);
}